

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_expr_sizeof(CPState *cp,CPValue *k,int wantsz)

{
  int iVar1;
  CTypeID CVar2;
  CTInfo CVar3;
  CTSize local_20;
  CTInfo info;
  CTSize sz;
  int wantsz_local;
  CPValue *k_local;
  CPState *cp_local;
  
  info = wantsz;
  _sz = k;
  k_local = (CPValue *)cp;
  iVar1 = cp_opt(cp,0x28);
  if (iVar1 == 0) {
    cp_expr_unary((CPState *)k_local,_sz);
  }
  else {
    iVar1 = cp_istypedecl((CPState *)k_local);
    if (iVar1 == 0) {
      cp_expr_comma((CPState *)k_local,_sz);
    }
    else {
      CVar2 = cp_decl_abstract((CPState *)k_local);
      _sz->id = CVar2;
    }
    cp_check((CPState *)k_local,0x29);
  }
  CVar3 = lj_ctype_info((CTState *)k_local[10],_sz->id,&local_20);
  if (info == 0) {
    (_sz->field_0).u32 = 1 << ((byte)(CVar3 >> 0x10) & 0xf);
  }
  else if (local_20 == 0xffffffff) {
    if (_sz->id != 0x15) {
      cp_err((CPState *)k_local,LJ_ERR_FFI_INVSIZE);
    }
  }
  else {
    (_sz->field_0).i32 = local_20;
  }
  _sz->id = 10;
  return;
}

Assistant:

static void cp_expr_sizeof(CPState *cp, CPValue *k, int wantsz)
{
  CTSize sz;
  CTInfo info;
  if (cp_opt(cp, '(')) {
    if (cp_istypedecl(cp))
      k->id = cp_decl_abstract(cp);
    else
      cp_expr_comma(cp, k);
    cp_check(cp, ')');
  } else {
    cp_expr_unary(cp, k);
  }
  info = lj_ctype_info(cp->cts, k->id, &sz);
  if (wantsz) {
    if (sz != CTSIZE_INVALID)
      k->u32 = sz;
    else if (k->id != CTID_A_CCHAR)  /* Special case for sizeof("string"). */
      cp_err(cp, LJ_ERR_FFI_INVSIZE);
  } else {
    k->u32 = 1u << ctype_align(info);
  }
  k->id = CTID_UINT32;  /* Really size_t. */
}